

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O3

void __thiscall
cp::PlanFootprints::setValues
          (PlanFootprints *this,walking_state wstate,rl swingleg,Vector3 *land_pos)

{
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar1;
  Scalar local_50;
  Scalar local_48;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_40;
  
  *(walking_state *)(this + 0x308) = wstate;
  *(rl *)(this + 0x2e0) = swingleg;
  if (wstate == stopping1) {
    local_40.m_row = 0;
    local_40.m_col = 1;
    local_40.m_currentBlockRows = 1;
    (land_pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
    [0] = 0.0;
    local_50 = 0.0;
    local_40.m_xpr = land_pos;
    pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                       (&local_40,&local_50);
    local_48 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar1,&local_48);
    if ((local_40.m_currentBlockRows + local_40.m_row != 3) || (local_40.m_col != 1))
    goto LAB_00108d3d;
  }
  local_40.m_xpr = (Matrix<double,_3,_1,_0,_3,_1> *)(this + 0x2e8);
  local_40.m_row = 0;
  local_40.m_col = 1;
  local_40.m_currentBlockRows = 1;
  *(double *)(this + 0x2e8) =
       (land_pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0];
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (&local_40,
                      (land_pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data.array + 1);
  local_50 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar1,&local_50);
  if ((local_40.m_currentBlockRows + local_40.m_row == 3) && (local_40.m_col == 1)) {
    *(double *)(this + 0x300) =
         (land_pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
         array[2];
    return;
  }
LAB_00108d3d:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
               );
}

Assistant:

void PlanFootprints::setValues(walking_state wstate, rl swingleg,
                               Vector3 land_pos) {
  this->wstate = wstate;
  this->swingleg = swingleg;
  if (wstate == stopping1) { land_pos << 0.0, 0.0, 0.0; }
  step_vector << land_pos.x(), land_pos.y(), 0.0;
  step_angle = land_pos.z();
}